

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5WriteDlidxAppend(Fts5Index *p,Fts5SegWriter *pWriter,i64 iRowid)

{
  int *pRc;
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  undefined1 *iVal;
  byte bVar7;
  Fts5DlidxWriter *pFVar8;
  long lVar9;
  Fts5Buffer *pBuf;
  i64 iVal_00;
  long lVar10;
  int *piVar11;
  long lVar12;
  Fts5DlidxWriter *pFVar13;
  long in_FS_OFFSET;
  int local_8c;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pRc = &p->rc;
  lVar12 = 0;
  local_8c = 2;
  lVar9 = 0x1000000000;
  lVar10 = 0;
  bVar6 = false;
  do {
    if (bVar6 || *pRc != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    pFVar8 = pWriter->aDlidx;
    iVar2 = *(int *)((long)&(pFVar8->buf).n + lVar12);
    iVar3 = p->pConfig->pgsz;
    if (iVar2 < iVar3) {
      if (*(int *)((long)&pFVar8->bPrevValid + lVar12) == 0) {
        pFVar13 = pFVar8 + lVar10;
        piVar11 = &pFVar13->bPrevValid;
        bVar6 = true;
        goto LAB_001caf98;
      }
      piVar11 = (int *)((long)&pFVar8->bPrevValid + lVar12);
      pFVar13 = (Fts5DlidxWriter *)((long)&pFVar8->pgno + lVar12);
      iVal_00 = iRowid - *(long *)((long)&pFVar8->iPrev + lVar12);
      bVar6 = true;
    }
    else {
      **(undefined1 **)((long)&(pFVar8->buf).p + lVar12) = 1;
      fts5DataWrite(p,((ulong)(uint)pWriter->iSegid << 0x25) + lVar9 +
                      (long)*(int *)((long)&pFVar8->pgno + lVar12),
                    *(u8 **)((long)&(pFVar8->buf).p + lVar12),
                    *(int *)((long)&(pFVar8->buf).n + lVar12));
      fts5WriteDlidxGrow(p,pWriter,local_8c);
      pFVar8 = pWriter->aDlidx;
      if ((p->rc == 0) && (*(int *)((long)&pFVar8[1].buf.n + lVar12) == 0)) {
        piVar11 = (int *)((long)&pFVar8->pgno + lVar12);
        pBuf = (Fts5Buffer *)(piVar11 + 0xc);
        local_40 = &DAT_aaaaaaaaaaaaaaaa;
        lVar5 = *(long *)(piVar11 + 4);
        bVar7 = sqlite3Fts5GetVarint((uchar *)(lVar5 + 1),(u64 *)&local_40);
        sqlite3Fts5GetVarint((uchar *)(lVar5 + (ulong)bVar7 + 1),(u64 *)&local_40);
        iVal = local_40;
        piVar11[8] = *piVar11;
        sqlite3Fts5BufferAppendVarint(pRc,pBuf,0);
        sqlite3Fts5BufferAppendVarint(pRc,pBuf,(long)*piVar11);
        sqlite3Fts5BufferAppendVarint(pRc,pBuf,(i64)iVal);
        piVar11[9] = 1;
        *(undefined1 **)(piVar11 + 10) = iVal;
      }
      piVar1 = (int *)((long)&pFVar8->pgno + lVar12);
      piVar11 = piVar1 + 1;
      piVar1[6] = 0;
      pFVar13 = (Fts5DlidxWriter *)((long)&pFVar8->pgno + lVar12);
      *piVar11 = 0;
      *piVar1 = *piVar1 + 1;
      bVar6 = false;
LAB_001caf98:
      pFVar8 = pFVar13 + -1;
      if (lVar12 == 0) {
        pFVar8 = (Fts5DlidxWriter *)&pWriter->writer;
      }
      iVar4 = pFVar8->pgno;
      sqlite3Fts5BufferAppendVarint(pRc,&pFVar13->buf,(ulong)(iVar3 <= iVar2));
      sqlite3Fts5BufferAppendVarint(pRc,&pFVar13->buf,(long)iVar4);
      iVal_00 = iRowid;
    }
    sqlite3Fts5BufferAppendVarint(pRc,&pFVar13->buf,iVal_00);
    *piVar11 = 1;
    pFVar13->iPrev = iRowid;
    lVar10 = lVar10 + 1;
    local_8c = local_8c + 1;
    lVar12 = lVar12 + 0x20;
    lVar9 = lVar9 + 0x80000000;
  } while( true );
}

Assistant:

static void fts5WriteDlidxAppend(
  Fts5Index *p,
  Fts5SegWriter *pWriter,
  i64 iRowid
){
  int i;
  int bDone = 0;

  for(i=0; p->rc==SQLITE_OK && bDone==0; i++){
    i64 iVal;
    Fts5DlidxWriter *pDlidx = &pWriter->aDlidx[i];

    if( pDlidx->buf.n>=p->pConfig->pgsz ){
      /* The current doclist-index page is full. Write it to disk and push
      ** a copy of iRowid (which will become the first rowid on the next
      ** doclist-index leaf page) up into the next level of the b-tree
      ** hierarchy. If the node being flushed is currently the root node,
      ** also push its first rowid upwards. */
      pDlidx->buf.p[0] = 0x01;    /* Not the root node */
      fts5DataWrite(p,
          FTS5_DLIDX_ROWID(pWriter->iSegid, i, pDlidx->pgno),
          pDlidx->buf.p, pDlidx->buf.n
      );
      fts5WriteDlidxGrow(p, pWriter, i+2);
      pDlidx = &pWriter->aDlidx[i];
      if( p->rc==SQLITE_OK && pDlidx[1].buf.n==0 ){
        i64 iFirst = fts5DlidxExtractFirstRowid(&pDlidx->buf);

        /* This was the root node. Push its first rowid up to the new root. */
        pDlidx[1].pgno = pDlidx->pgno;
        sqlite3Fts5BufferAppendVarint(&p->rc, &pDlidx[1].buf, 0);
        sqlite3Fts5BufferAppendVarint(&p->rc, &pDlidx[1].buf, pDlidx->pgno);
        sqlite3Fts5BufferAppendVarint(&p->rc, &pDlidx[1].buf, iFirst);
        pDlidx[1].bPrevValid = 1;
        pDlidx[1].iPrev = iFirst;
      }

      sqlite3Fts5BufferZero(&pDlidx->buf);
      pDlidx->bPrevValid = 0;
      pDlidx->pgno++;
    }else{
      bDone = 1;
    }

    if( pDlidx->bPrevValid ){
      iVal = (u64)iRowid - (u64)pDlidx->iPrev;
    }else{
      i64 iPgno = (i==0 ? pWriter->writer.pgno : pDlidx[-1].pgno);
      assert( pDlidx->buf.n==0 );
      sqlite3Fts5BufferAppendVarint(&p->rc, &pDlidx->buf, !bDone);
      sqlite3Fts5BufferAppendVarint(&p->rc, &pDlidx->buf, iPgno);
      iVal = iRowid;
    }

    sqlite3Fts5BufferAppendVarint(&p->rc, &pDlidx->buf, iVal);
    pDlidx->bPrevValid = 1;
    pDlidx->iPrev = iRowid;
  }
}